

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O0

void __thiscall
foxxll::disk_block_allocator::add_free_region
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  bool bVar3;
  pointer ppVar4;
  ulong uVar5;
  ostream *poVar6;
  bad_ext_alloc *pbVar7;
  size_type sVar8;
  reference ppVar9;
  mapped_type *pmVar10;
  _Self local_3f8;
  _Base_ptr local_3f0;
  _Base_ptr local_3e8;
  _Self local_3e0;
  byte local_3d1;
  iterator iStack_3d0;
  bool succ_is_not_the_first;
  _Base_ptr local_3c8;
  _Self local_3c0;
  _Self local_3b8;
  undefined1 local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream msg_1;
  _Self local_210;
  undefined1 local_201;
  string local_200;
  ostringstream local_1d0 [8];
  ostringstream msg;
  _Self local_58;
  _Base_ptr local_50;
  _Self local_48;
  _Self local_40;
  iterator pred;
  iterator succ;
  uint64_t region_size;
  uint64_t region_pos;
  uint64_t block_size_local;
  uint64_t block_pos_local;
  disk_block_allocator *this_local;
  
  region_size = block_pos;
  region_pos = block_size;
  block_size_local = block_pos;
  block_pos_local = (uint64_t)this;
  bVar3 = std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::empty(&this->free_space_);
  succ._M_node = (_Base_ptr)block_size;
  if (!bVar3) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::upper_bound(&this->free_space_,&region_size);
    pred._M_node = local_40._M_node;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(&this->free_space_);
    bVar3 = std::operator!=(&local_40,&local_48);
    if (bVar3) {
      local_50 = (_Base_ptr)
                 std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator--
                           (&local_40,0);
    }
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->free_space_);
    bVar3 = std::operator!=(&local_40,&local_58);
    if ((bVar3) &&
       (ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                           (&local_40), ppVar4->first <= region_size)) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&local_40);
      uVar1 = ppVar4->first;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&local_40);
      if (region_size < uVar1 + ppVar4->second) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar6 = std::operator<<((ostream *)local_1d0,"Error in ");
        poVar6 = std::operator<<(poVar6,"disk_block_allocator::check_corruption");
        poVar6 = std::operator<<(poVar6," : ");
        poVar6 = std::operator<<(poVar6,
                                 "Error: double deallocation of external memory, trying to deallocate region "
                                );
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,region_size);
        poVar6 = std::operator<<(poVar6," + ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,block_size);
        poVar6 = std::operator<<(poVar6," in empty space[");
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                           (&local_40);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar4->first);
        poVar6 = std::operator<<(poVar6," + ");
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                           (&local_40);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar4->second);
        std::operator<<(poVar6,"]");
        local_201 = 1;
        pbVar7 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        bad_ext_alloc::bad_ext_alloc(pbVar7,&local_200);
        local_201 = 0;
        __cxa_throw(pbVar7,&bad_ext_alloc::typeinfo,bad_ext_alloc::~bad_ext_alloc);
      }
    }
    local_210._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->free_space_);
    bVar3 = std::operator!=(&pred,&local_210);
    uVar2 = region_size;
    if (((bVar3) &&
        (ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                            (&pred), uVar2 <= ppVar4->first)) &&
       (uVar5 = region_size + block_size,
       ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                          (&pred), ppVar4->first < uVar5)) {
      std::__cxx11::ostringstream::ostringstream(local_388);
      poVar6 = std::operator<<((ostream *)local_388,"Error in ");
      poVar6 = std::operator<<(poVar6,"disk_block_allocator::check_corruption");
      poVar6 = std::operator<<(poVar6," : ");
      poVar6 = std::operator<<(poVar6,
                               "Error: double deallocation of external memory, trying to deallocate region "
                              );
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,region_size);
      poVar6 = std::operator<<(poVar6," + ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,block_size);
      poVar6 = std::operator<<(poVar6,"  which overlaps empty space [");
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&pred);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar4->first);
      poVar6 = std::operator<<(poVar6," + ");
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         (&pred);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ppVar4->second);
      std::operator<<(poVar6,"]");
      local_3a9 = 1;
      pbVar7 = (bad_ext_alloc *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      bad_ext_alloc::bad_ext_alloc(pbVar7,&local_3a8);
      local_3a9 = 0;
      __cxa_throw(pbVar7,&bad_ext_alloc::typeinfo,bad_ext_alloc::~bad_ext_alloc);
    }
    local_3b8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->free_space_);
    bVar3 = std::operator==(&pred,&local_3b8);
    if (bVar3) {
      local_3c0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end(&this->free_space_);
      bVar3 = std::operator==(&local_40,&local_3c0);
      if (bVar3) {
        deallocation_error(this,block_size_local,region_pos,&local_40,&pred);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                      ,0x6a,"void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)"
                     );
      }
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                         (&local_40);
      uVar1 = ppVar9->first;
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                         (&local_40);
      if (uVar1 + ppVar9->second == region_size) {
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                           (&local_40);
        succ._M_node = (_Base_ptr)(ppVar9->second + block_size);
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                           (&local_40);
        region_size = ppVar9->first;
        local_3c8 = local_40._M_node;
        iStack_3d0 = std::
                     map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                     ::erase_abi_cxx11_((map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                         *)&this->free_space_,local_40._M_node);
      }
    }
    else {
      sVar8 = std::
              map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::size(&this->free_space_);
      if (sVar8 < 2) {
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                           (&pred);
        if (ppVar9->first == region_size + block_size) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                             (&pred);
          succ._M_node = (_Base_ptr)(ppVar9->second + block_size);
          std::
          map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::erase_abi_cxx11_((map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                              *)&this->free_space_,pred);
        }
      }
      else {
        local_3e0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::begin(&this->free_space_);
        local_3d1 = std::operator!=(&pred,&local_3e0);
        ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                           (&pred);
        if (ppVar9->first == region_size + block_size) {
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                             (&pred);
          succ._M_node = (_Base_ptr)(ppVar9->second + block_size);
          local_3e8 = pred._M_node;
          local_3f0 = (_Base_ptr)
                      std::
                      map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      ::erase_abi_cxx11_((map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                          *)&this->free_space_,pred);
          if ((local_3d1 & 1) != 0) {
            pred._M_node = local_40._M_node;
          }
        }
        if ((local_3d1 & 1) != 0) {
          local_3f8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::end(&this->free_space_);
          bVar3 = std::operator==(&local_40,&local_3f8);
          if (bVar3) {
            deallocation_error(this,block_size_local,region_pos,&local_40,&pred);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/disk_block_allocator.cpp"
                          ,0x83,
                          "void foxxll::disk_block_allocator::add_free_region(uint64_t, uint64_t)");
          }
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                             (&local_40);
          uVar1 = ppVar9->first;
          ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                             (&local_40);
          if (uVar1 + ppVar9->second == region_size) {
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                     operator*(&local_40);
            succ._M_node = (_Base_ptr)((long)&(succ._M_node)->_M_color + ppVar9->second);
            ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                     operator*(&local_40);
            region_size = ppVar9->first;
            std::
            map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
            ::erase_abi_cxx11_((map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                *)&this->free_space_,(iterator)local_40._M_node);
          }
        }
      }
    }
  }
  pmVar10 = std::
            map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::operator[](&this->free_space_,&region_size);
  *pmVar10 = (mapped_type)succ._M_node;
  this->free_bytes_ = region_pos + this->free_bytes_;
  return;
}

Assistant:

void disk_block_allocator::add_free_region(uint64_t block_pos, uint64_t block_size)
{
    TLX_LOG << "Deallocating a block with size: " << block_size << " position: " << block_pos;
    uint64_t region_pos = block_pos;
    uint64_t region_size = block_size;

    // First we try to find adjacent free slots and if successful we coalesce them
    // During this procedure we also identify double-frees and similar issues
    if (!free_space_.empty())
    {
        auto succ = free_space_.upper_bound(region_pos);
        auto pred = succ;

        if (pred != free_space_.begin())
            pred--;

        if (pred != free_space_.end()) {
            if (pred->first <= region_pos && (pred->first + pred->second) > region_pos) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << " in empty space"
                        "[" << pred->first << " + " << pred->second << "]"
                );
            }
        }

        if (succ != free_space_.end()) {
            if (region_pos <= succ->first && (region_pos + region_size) > succ->first) {
                FOXXLL_THROW2(
                    bad_ext_alloc, "disk_block_allocator::check_corruption",
                    "Error: double deallocation of external memory, trying to deallocate "
                    "region " << region_pos << " + " << region_size << "  which overlaps empty space "
                        "[" << succ->first << " + " << succ->second << "]"
                );
            }
        }

        if (succ == free_space_.end()) {
            if (pred == free_space_.end()) {
                deallocation_error(block_pos, block_size, pred, succ);
                assert(false);
            }
            else if ((*pred).first + (*pred).second == region_pos) {
                // coalesce with predecessor
                region_size += (*pred).second;
                region_pos = (*pred).first;
                free_space_.erase(pred);
            }
        }
        else {
            if (free_space_.size() > 1) {
                // check it now, as succ may change!
                const bool succ_is_not_the_first = (succ != free_space_.begin());

                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                    if (succ_is_not_the_first)
                        succ = pred;
                }

                if (succ_is_not_the_first) {
                    if (pred == free_space_.end()) {
                        deallocation_error(block_pos, block_size, pred, succ);
                        assert(false);
                    }
                    else if ((*pred).first + (*pred).second == region_pos) {
                        // coalesce with predecessor
                        region_size += (*pred).second;
                        region_pos = (*pred).first;
                        free_space_.erase(pred);
                    }
                }
            }
            else {
                if ((*succ).first == region_pos + region_size) {
                    // coalesce with successor
                    region_size += (*succ).second;
                    free_space_.erase(succ);
                }
            }
        }
    }

    free_space_[region_pos] = region_size;
    free_bytes_ += block_size;
}